

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall detail::writer::operator()(writer *this,string *val)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_short local_12;
  
  operator()(this,&local_12);
  uVar1 = (this->buf_).size_;
  uVar2 = val->_M_string_length;
  if (uVar1 < val->_M_string_length) {
    uVar2 = uVar1;
  }
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    memcpy((this->buf_).data_,(val->_M_dataplus)._M_p,uVar2);
    uVar1 = (this->buf_).size_;
    uVar2 = val->_M_string_length;
    if (uVar1 < val->_M_string_length) {
      uVar2 = uVar1;
    }
  }
  (this->buf_).data_ = (void *)((long)(this->buf_).data_ + uVar2);
  (this->buf_).size_ = uVar1 - uVar2;
  return;
}

Assistant:

void operator()(std::string const& val) const {
        (*this)(static_cast<uint16_t>(val.size()));
        asio::buffer_copy(buf_, asio::buffer(val));
        buf_ = buf_ + val.length();
    }